

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O3

callback_t *
begin_property_set_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  QTextStream *pQVar1;
  long lVar2;
  int iVar3;
  QDebug *debug;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  string tmp;
  string value;
  string name;
  QTextStream *local_f8;
  QString local_f0;
  callback_t *local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = 0;
  local_d8 = __return_storage_ptr__;
  std::istream::ignore();
  while( true ) {
    std::operator>>((istream *)f,(string *)&local_50);
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar3 == 0) break;
    std::operator>>((istream *)f,(string *)&local_d0);
    iVar3 = std::__cxx11::string::compare((char *)&local_d0);
    if (iVar3 == 0) break;
    std::operator>>((istream *)f,(string *)&local_70);
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar3 == 0) break;
    iVar3 = std::__cxx11::string::compare((char *)&local_50);
    if (iVar3 == 0) {
      parser();
      if ((parser()::category[0x10] & 1) != 0) {
        parser();
        local_b0.first._M_dataplus._M_p._0_4_ = 2;
        local_b0.first._M_dataplus._M_p._4_4_ = 0;
        local_b0.first._M_string_length._0_4_ = 0;
        local_b0.first._M_string_length._4_4_ = 0;
        local_b0.first.field_2._M_allocated_capacity._0_4_ = 0;
        local_b0.first.field_2._M_allocated_capacity._4_4_ = 0;
        local_b0.first.field_2._8_8_ = parser()::category._8_8_;
        QMessageLogger::debug();
        pQVar1 = local_f8;
        QVar6.m_data = (storage_type *)0x1a;
        QVar6.m_size = (qsizetype)&local_f0;
        QString::fromUtf8(QVar6);
        QTextStream::operator<<(pQVar1,&local_f0);
        if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_f8[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(local_f8,' ');
        }
        operator<<((QDebug *)&local_f8,&local_70);
        QDebug::~QDebug((QDebug *)&local_f8);
      }
      std::__cxx11::string::_M_assign((string *)((anonymous_namespace)::current_property + 0x30));
    }
    else {
      parser();
      if ((parser()::category[0x10] & 1) != 0) {
        parser();
        local_b0.first._M_dataplus._M_p._0_4_ = 2;
        local_b0.first._M_dataplus._M_p._4_4_ = 0;
        local_b0.first._M_string_length._0_4_ = 0;
        local_b0.first._M_string_length._4_4_ = 0;
        local_b0.first.field_2._M_allocated_capacity._0_4_ = 0;
        local_b0.first.field_2._M_allocated_capacity._4_4_ = 0;
        local_b0.first.field_2._8_8_ = parser()::category._8_8_;
        QMessageLogger::debug();
        pQVar1 = local_f8;
        QVar4.m_data = (storage_type *)0xd;
        QVar4.m_size = (qsizetype)&local_f0;
        QString::fromUtf8(QVar4);
        QTextStream::operator<<(pQVar1,&local_f0);
        if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
          }
        }
        if (local_f8[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(local_f8,' ');
        }
        debug = operator<<((QDebug *)&local_f8,&local_50);
        pQVar1 = *(QTextStream **)debug;
        QVar5.m_data = (storage_type *)0xc;
        QVar5.m_size = (qsizetype)&local_f0;
        QString::fromUtf8(QVar5);
        QTextStream::operator<<(pQVar1,&local_f0);
        if (&(local_f0.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_f0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_f0.d.d)->super_QArrayData,2,8);
          }
        }
        if ((*(QTextStream **)debug)[0x30] == (QTextStream)0x1) {
          QTextStream::operator<<(*(QTextStream **)debug,' ');
        }
        operator<<(debug,&local_70);
        QDebug::~QDebug((QDebug *)&local_f8);
      }
      lVar2 = (anonymous_namespace)::current_property;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_b0,&local_50,&local_70);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)(lVar2 + 0x70),&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.second._M_dataplus._M_p != &local_b0.second.field_2) {
        operator_delete(local_b0.second._M_dataplus._M_p,
                        local_b0.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_b0.first._M_dataplus._M_p._4_4_,local_b0.first._M_dataplus._M_p._0_4_)
          != &local_b0.first.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_b0.first._M_dataplus._M_p._4_4_,
                                 local_b0.first._M_dataplus._M_p._0_4_),
                        CONCAT44(local_b0.first.field_2._M_allocated_capacity._4_4_,
                                 local_b0.first.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
  }
  *(undefined8 *)((long)&(local_d8->super__Function_base)._M_functor + 8) = 0;
  *(code **)&(local_d8->super__Function_base)._M_functor = end_property_state;
  local_d8->_M_invoker =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_invoke;
  (local_d8->super__Function_base)._M_manager =
       std::
       _Function_handler<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&),_std::function<RecursiveHelper<MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&>_(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>_(*)(MetaConfiguration_&,_std::basic_ifstream<char,_std::char_traits<char>_>_&,_int_&)>
       ::_M_manager;
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return local_d8;
}

Assistant:

callback_t begin_property_set_state(MetaConfiguration &conf, std::ifstream &f,
                                    int &error) {
  std::string name;
  std::string value;
  std::string tmp;
  f.ignore(); // ignoring {

  do {
    f >> name;
    if (name == "}")
      break;

    f >> tmp;
    if (tmp == "}")
      break;

    f >> value;
    if (value == "}")
      break;

    if (name == "value") {
      qCDebug(parser) << "found value for property  " << value;
      current_property->default_value = value;
    } else {
      qCDebug(parser) << "found setter " << name << " with value " << value;
      current_property->setters.insert(std::make_pair(name, value));
    }
  } while (true);
  return end_property_state;
}